

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printMemExtend(MCInst *MI,uint OpNum,SStream *O,char SrcRegKind,uint Width)

{
  cs_detail *pcVar1;
  uint uVar2;
  char cVar3;
  uint uVar4;
  MCOperand *pMVar5;
  int64_t iVar6;
  int64_t iVar7;
  uint8_t *puVar8;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  SStream *ss;
  int iVar9;
  
  ss = (SStream *)CONCAT44(in_register_00000034,OpNum);
  cVar3 = (char)O;
  pMVar5 = MCInst_getOperand(MI,3);
  iVar6 = MCOperand_getImm(pMVar5);
  pMVar5 = MCInst_getOperand(MI,4);
  iVar7 = MCOperand_getImm(pMVar5);
  iVar9 = (int)iVar6;
  if (cVar3 == 'x' && iVar9 == 0) {
    SStream_concat0(ss,"lsl");
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar1 = MI->flat_insn->detail;
      puVar8 = pcVar1->groups + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 0x22;
      puVar8[0] = '\x01';
      puVar8[1] = '\0';
      puVar8[2] = '\0';
      puVar8[3] = '\0';
    }
  }
  else {
    SStream_concat(ss,"%cxt%c",(ulong)((uint)(iVar9 == 0) * 2 + 0x73),(ulong)O & 0xff);
    if (MI->csh->detail != CS_OPT_OFF) {
      if (iVar9 == 0) {
        if (cVar3 == 'w') {
          pcVar1 = MI->flat_insn->detail;
          puVar8 = pcVar1->groups + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 0x2a;
          puVar8[0] = '\x03';
          puVar8[1] = '\0';
          puVar8[2] = '\0';
          puVar8[3] = '\0';
        }
      }
      else {
        pcVar1 = MI->flat_insn->detail;
        puVar8 = pcVar1->groups + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 0x2a;
        if (cVar3 == 'x') {
          puVar8[0] = '\b';
          puVar8[1] = '\0';
          puVar8[2] = '\0';
          puVar8[3] = '\0';
        }
        else {
          puVar8[0] = '\a';
          puVar8[1] = '\0';
          puVar8[2] = '\0';
          puVar8[3] = '\0';
        }
      }
    }
  }
  if (!(bool)(~(cVar3 == 'x' && iVar9 == 0) & (int)iVar7 == 0)) {
    uVar4 = (uint)CONCAT71(in_register_00000009,SrcRegKind) >> 3;
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    SStream_concat(ss," #%u",(ulong)uVar2);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar1 = MI->flat_insn->detail;
      puVar8 = pcVar1->groups + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 0x22;
      puVar8[0] = '\x01';
      puVar8[1] = '\0';
      puVar8[2] = '\0';
      puVar8[3] = '\0';
      pcVar1 = MI->flat_insn->detail;
      *(uint *)(pcVar1->groups + (ulong)((uint)(pcVar1->field_6).x86.opcode[2] * 0x30) + 0x26) =
           uVar2;
    }
  }
  return;
}

Assistant:

static void printMemExtend(MCInst *MI, unsigned OpNum, SStream *O, char SrcRegKind, unsigned Width)
{
	unsigned SignExtend = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned DoShift = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1));

	// sxtw, sxtx, uxtw or lsl (== uxtx)
	bool IsLSL = !SignExtend && SrcRegKind == 'x';
	if (IsLSL) {
		SStream_concat0(O, "lsl");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.type = ARM64_SFT_LSL;
		}
	} else {
		SStream_concat(O, "%cxt%c", (SignExtend ? 's' : 'u'), SrcRegKind);
		if (MI->csh->detail) {
			if (!SignExtend) {
				switch(SrcRegKind) {
					default: break;
					case 'b':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTB;
							 break;
					case 'h':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTH;
							 break;
					case 'w':
							 MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_UXTW;
							 break;
				}
			} else {
					switch(SrcRegKind) {
						default: break;
						case 'b':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTB;
							break;
						case 'h':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTH;
							break;
						case 'w':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTW;
							break;
						case 'x':
							MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].ext = ARM64_EXT_SXTX;
							break;
					}
			}
		}
	}

	if (DoShift || IsLSL) {
		SStream_concat(O, " #%u", Log2_32(Width / 8));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.type = ARM64_SFT_LSL;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].shift.value = Log2_32(Width / 8);
		}
	}
}